

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nva.c
# Opt level: O0

int nva_init(void)

{
  int iVar1;
  long lVar2;
  pci_device *ppVar3;
  nva_card *pnVar4;
  long lVar5;
  nva_card *card;
  nva_card *card_1;
  pci_device *dev;
  pci_device_iterator *it;
  int j;
  int i;
  int ret;
  
  iVar1 = pci_system_init();
  if (iVar1 == 0) {
    nva_vgaarberr = pci_device_vgaarb_init();
    for (it._4_4_ = 0; it._4_4_ < 4; it._4_4_ = it._4_4_ + 1) {
      for (it._0_4_ = 0; (ulong)(long)(int)it < nva_types[(int)it._4_4_].len; it._0_4_ = (int)it + 1
          ) {
        lVar2 = pci_id_match_iterator_create(nva_types[(int)it._4_4_].match + (int)it);
        if (lVar2 == 0) {
          pci_system_cleanup();
          return -1;
        }
        while (ppVar3 = (pci_device *)pci_device_next(lVar2), ppVar3 != (pci_device *)0x0) {
          iVar1 = pci_device_probe(ppVar3);
          if (iVar1 == 0) {
            pci_device_enable(ppVar3);
            pnVar4 = (*nva_types[(int)it._4_4_].func)(ppVar3);
            if (pnVar4 != (nva_card *)0x0) {
              if (nva_cardsmax <= nva_cardsnum) {
                if (nva_cardsmax == 0) {
                  nva_cardsmax = 0x10;
                }
                else {
                  nva_cardsmax = nva_cardsmax << 1;
                }
                nva_cards = (nva_card **)realloc(nva_cards,(long)nva_cardsmax << 3);
              }
              lVar5 = (long)nva_cardsnum;
              nva_cardsnum = nva_cardsnum + 1;
              nva_cards[lVar5] = pnVar4;
            }
          }
          else {
            fprintf(_stderr,"WARN: Can\'t probe %04x:%02x:%02x.%x\n",(ulong)ppVar3->domain,
                    (ulong)ppVar3->bus,(ulong)ppVar3->dev,(ulong)ppVar3->func);
          }
        }
        pci_iterator_destroy(lVar2);
      }
    }
    pnVar4 = nva_init_platform();
    if (pnVar4 != (nva_card *)0x0) {
      if (nva_cardsmax <= nva_cardsnum) {
        if (nva_cardsmax == 0) {
          nva_cardsmax = 0x10;
        }
        else {
          nva_cardsmax = nva_cardsmax << 1;
        }
        nva_cards = (nva_card **)realloc(nva_cards,(long)nva_cardsmax << 3);
      }
      lVar2 = (long)nva_cardsnum;
      nva_cardsnum = nva_cardsnum + 1;
      nva_cards[lVar2] = pnVar4;
    }
    i = (int)(nva_cardsnum == 0);
  }
  else {
    i = -1;
  }
  return i;
}

Assistant:

int nva_init() {
	int ret;
	ret = pci_system_init();
	if (ret)
		return -1;
	nva_vgaarberr = pci_device_vgaarb_init();
	int i, j;

	for (i = 0; i < ARRAY_SIZE(nva_types); i++) {
		for (j = 0; j < nva_types[i].len; j++) {
			struct pci_device_iterator* it = pci_id_match_iterator_create(&nva_types[i].match[j]);
			if (!it) {
				pci_system_cleanup();
				return -1;
			}

			struct pci_device *dev;
			while ((dev = pci_device_next(it))) {
				ret = pci_device_probe(dev);
				if (ret) {
					fprintf (stderr, "WARN: Can't probe %04x:%02x:%02x.%x\n", dev->domain, dev->bus, dev->dev, dev->func);
					continue;
				}
				pci_device_enable(dev);
				struct nva_card *card = nva_types[i].func(dev);
				if (card)
					ADDARRAY(nva_cards, card);
			}
			pci_iterator_destroy(it);
		}
	}

	/* Finally, try reading the platform */
	struct nva_card *card = nva_init_platform();
	if (card)
		ADDARRAY(nva_cards, card);

	return (nva_cardsnum == 0);
}